

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

TimeProcessingResult __thiscall
helics::TimeDependencies::updateTime(TimeDependencies *this,ActionMessage *cmd)

{
  ConnectionType CVar1;
  bool bVar2;
  uint16_t uVar3;
  ushort uVar4;
  action_t aVar5;
  baseType bVar6;
  long lVar7;
  DependencyInfo *pDVar8;
  TimeProcessingResult TVar9;
  TimeProcessingResult TVar10;
  uint uVar11;
  TimeState TVar12;
  long lVar13;
  
  pDVar8 = getDependencyInfo(this,(GlobalFederateId)(cmd->source_id).gid);
  if ((pDVar8 == (DependencyInfo *)0x0) || (pDVar8->dependency != true)) {
    return NOT_PROCESSED;
  }
  aVar5 = cmd->messageAction;
  if (aVar5 < cmd_time_grant) {
    if (aVar5 < cmd_disconnect_fed) {
      if ((aVar5 != cmd_priority_disconnect) && (aVar5 != cmd_disconnect)) {
        return NOT_PROCESSED;
      }
    }
    else if (3 < (uint)(aVar5 + (cmd_route_ack|cmd_init))) {
      if (aVar5 == cmd_exec_request) {
        uVar4 = cmd->flags;
        TVar12 = exec_requested;
        if ((uVar4 & 1) != 0) {
          TVar12 = ((uVar4 & 4) == 0) + exec_requested_require_iteration;
        }
        (pDVar8->super_TimeData).mTimeState = TVar12;
        CVar1 = pDVar8->connection;
        bVar2 = (pDVar8->super_TimeData).delayedTiming;
        (pDVar8->super_TimeData).delayedTiming = SUB41((uVar4 & 0x400) >> 10,0);
        (pDVar8->super_TimeData).restrictionLevel = (uint8_t)cmd->messageID;
        uVar11 = (uint)cmd->counter;
        (pDVar8->super_TimeData).sequenceCounter = (uint)cmd->counter;
        (pDVar8->super_TimeData).minFed.gid = (cmd->dest_handle).hid;
        if (CVar1 != SELF) {
          uVar11 = (cmd->source_handle).hid;
        }
        TVar10 = PROCESSED_AND_CHECK - ((uVar4 & 0x400) == 0 | bVar2 & 1U);
        (pDVar8->super_TimeData).responseSequenceCounter = uVar11;
        if (uVar11 != (pDVar8->super_TimeData).grantedIteration) {
          return TVar10;
        }
        goto LAB_00302a07;
      }
      if (aVar5 != cmd_exec_grant) {
        return NOT_PROCESSED;
      }
      if ((cmd->flags & 1) == 0) {
        uVar11 = 0;
        (pDVar8->super_TimeData).timeoutCount = 0;
        (pDVar8->super_TimeData).grantedIteration = 0;
        (pDVar8->super_TimeData).next.internalTimeCode = 0;
        (pDVar8->super_TimeData).Te.internalTimeCode = 0;
        (pDVar8->super_TimeData).minDe.internalTimeCode = 0;
        (pDVar8->super_TimeData).minFed.gid = -2010000000;
        TVar12 = time_granted;
      }
      else {
        uVar11 = (uint)cmd->counter;
        TVar12 = initialized;
      }
      (pDVar8->super_TimeData).mTimeState = TVar12;
      (pDVar8->super_TimeData).sequenceCounter = uVar11;
      (pDVar8->super_TimeData).responseSequenceCounter = 0;
      (pDVar8->super_TimeData).restrictionLevel = '\0';
      goto LAB_00302a25;
    }
    (pDVar8->super_TimeData).mTimeState = time_granted;
    (pDVar8->super_TimeData).hasData = false;
    (pDVar8->super_TimeData).next.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).Te.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).minDe.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).minFed.gid = -2010000000;
    (pDVar8->super_TimeData).timeoutCount = 0;
    pDVar8->updateRequested = false;
    return PROCESSED;
  }
  if (aVar5 < cmd_time_request) {
    if (aVar5 < cmd_pub) {
      if (aVar5 != cmd_time_grant) {
        if (aVar5 == cmd_request_current_time) {
          (pDVar8->super_TimeData).sequenceCounter = (uint)cmd->counter;
          return PROCESSED;
        }
        return NOT_PROCESSED;
      }
      (pDVar8->super_TimeData).mTimeState = time_granted;
      bVar6 = (cmd->actionTime).internalTimeCode;
      (pDVar8->super_TimeData).next.internalTimeCode = bVar6;
      (pDVar8->super_TimeData).Te.internalTimeCode = bVar6;
      (pDVar8->super_TimeData).minDe.internalTimeCode = bVar6;
      (pDVar8->super_TimeData).minFed.gid = -2010000000;
      (pDVar8->super_TimeData).timeoutCount = 0;
      (pDVar8->super_TimeData).interrupted = false;
      (pDVar8->super_TimeData).sequenceCounter = (uint)cmd->counter;
LAB_00302a25:
      (pDVar8->super_TimeData).hasData = false;
      return PROCESSED;
    }
    if (aVar5 != cmd_pub) {
      if (aVar5 == cmd_timing_info) {
        uVar3 = cmd->flags;
        pDVar8->nonGranting = (bool)((byte)uVar3 >> 7);
        (pDVar8->super_TimeData).delayedTiming = (bool)((byte)(uVar3 >> 10) & 1);
        (pDVar8->super_TimeData).timingVersion = (int8_t)(cmd->dest_handle).hid;
        return PROCESSED_AND_CHECK;
      }
      return NOT_PROCESSED;
    }
LAB_0030288a:
    (pDVar8->super_TimeData).hasData = true;
  }
  else {
    if (aVar5 < cmd_global_error) {
      if (aVar5 == cmd_time_request) {
        TVar10 = PROCESSED;
        if ((pDVar8->super_TimeData).mTimeState == time_granted) {
          (pDVar8->super_TimeData).lastGrant.internalTimeCode =
               (pDVar8->super_TimeData).next.internalTimeCode;
          TVar10 = PROCESSED_NEW_REQUEST;
        }
        uVar4 = cmd->flags;
        TVar12 = time_requested;
        if ((uVar4 & 1) != 0) {
          TVar12 = (uVar4 & 4) == 0 | time_requested_require_iteration;
        }
        (pDVar8->super_TimeData).mTimeState = TVar12;
        (pDVar8->super_TimeData).next.internalTimeCode = (cmd->actionTime).internalTimeCode;
        lVar7 = (cmd->Te).internalTimeCode;
        (pDVar8->super_TimeData).Te.internalTimeCode = lVar7;
        lVar13 = (cmd->Tdemin).internalTimeCode;
        if (lVar7 < lVar13) {
          lVar13 = lVar7;
        }
        (pDVar8->super_TimeData).minDe.internalTimeCode = lVar13;
        (pDVar8->super_TimeData).minFed.gid = (cmd->dest_handle).hid;
        (pDVar8->super_TimeData).interrupted = (bool)((byte)(uVar4 >> 8) & 1);
        if ((char)(byte)uVar4 < '\0') {
          pDVar8->nonGranting = true;
        }
        TVar9 = PROCESSED_AND_CHECK;
        if (((pDVar8->super_TimeData).delayedTiming & 1U) != 0) {
          TVar9 = TVar10;
        }
        if ((uVar4 >> 10 & 1) != 0) {
          (pDVar8->super_TimeData).delayedTiming = true;
          TVar10 = TVar9;
        }
        pDVar8->triggered = (bool)((byte)uVar4 >> 1 & 1);
        uVar11 = (uint)cmd->counter;
        (pDVar8->super_TimeData).sequenceCounter = (uint)cmd->counter;
        if (pDVar8->connection != SELF) {
          uVar11 = (cmd->source_handle).hid;
        }
        (pDVar8->super_TimeData).responseSequenceCounter = uVar11;
        if (uVar11 != (pDVar8->super_TimeData).grantedIteration) {
          return TVar10;
        }
LAB_00302a07:
        pDVar8->updateRequested = false;
        return TVar10;
      }
      if (aVar5 != cmd_local_error) {
        return NOT_PROCESSED;
      }
    }
    else if (aVar5 != cmd_global_error) {
      if (aVar5 != cmd_send_message) {
        return NOT_PROCESSED;
      }
      goto LAB_0030288a;
    }
    (pDVar8->super_TimeData).mTimeState = error;
    (pDVar8->super_TimeData).next.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).Te.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).minDe.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).minFed.gid = -2010000000;
    (pDVar8->super_TimeData).timeoutCount = 0;
  }
  return PROCESSED;
}

Assistant:

TimeProcessingResult TimeDependencies::updateTime(const ActionMessage& cmd)
{
    auto* depInfo = getDependencyInfo(cmd.source_id);
    if (depInfo == nullptr || !depInfo->dependency) {
        return TimeProcessingResult::NOT_PROCESSED;
    }
    return processMessage(cmd, *depInfo);
}